

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MES.h
# Opt level: O0

char * FindLatestMESMessage(char *str)

{
  char *local_20;
  char *foundstr;
  char *ptr;
  char *str_local;
  
  local_20 = (char *)0x0;
  for (foundstr = FindMESMessage(str); foundstr != (char *)0x0;
      foundstr = FindMESMessage(foundstr + 1)) {
    local_20 = foundstr;
  }
  return local_20;
}

Assistant:

inline char* FindLatestMESMessage(char* str)
{
	char* ptr = NULL;
	char* foundstr = NULL;

	ptr = FindMESMessage(str);
	while (ptr) 
	{
		// Save the position of the beginning of the message.
		foundstr = ptr;

		// Search just after the beginning of the message.
		ptr = FindMESMessage(foundstr+1);
	}

	return foundstr;
}